

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::wheelEvent(QAbstractSpinBox *this,QWheelEvent *event)

{
  int iVar1;
  uint uVar2;
  Int IVar3;
  Int IVar4;
  QAbstractSpinBoxPrivate *pQVar5;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  uint __fd;
  QEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int steps;
  QAbstractSpinBoxPrivate *d;
  StepEnabledFlag in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_1c;
  undefined4 local_18;
  QFlagsStorageHelper<QAbstractSpinBox::StepEnabledFlag,_4> local_14;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QAbstractSpinBox *)0x68922f);
  local_10 = QWheelEvent::angleDelta
                       ((QWheelEvent *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                       );
  iVar1 = QPoint::y((QPoint *)0x68924d);
  pQVar5->wheelDeltaRemainder = iVar1 + pQVar5->wheelDeltaRemainder;
  uVar2 = pQVar5->wheelDeltaRemainder / 0x78;
  pQVar5->wheelDeltaRemainder = pQVar5->wheelDeltaRemainder + uVar2 * -0x78;
  local_18 = (**(code **)(*in_RDI + 0x1c8))();
  __addr_len = (socklen_t *)(ulong)uVar2;
  __fd = 2;
  if (0 < (int)uVar2) {
    __fd = 1;
  }
  local_14.super_QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>.i =
       (QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>)
       QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                 ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)
                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  __addr = extraout_RDX;
  if (IVar3 != 0) {
    QInputEvent::modifiers
              ((QInputEvent *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_1c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)
                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
    __fd = uVar2;
    if (IVar4 != 0) {
      __fd = uVar2 * 10;
    }
    (**(code **)(*in_RDI + 0x1b0))();
    __addr = extraout_RDX_00;
  }
  QEvent::accept(in_RSI,__fd,__addr,__addr_len);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::wheelEvent(QWheelEvent *event)
{
    Q_D(QAbstractSpinBox);
#ifdef Q_OS_MACOS
    // If the event comes from a real mouse wheel, rather than a track pad
    // (Qt::MouseEventSynthesizedBySystem), the shift modifier changes the
    // scroll orientation to horizontal.
    // Convert horizontal events back to vertical whilst shift is held.
    if ((event->modifiers() & Qt::ShiftModifier)
            && event->source() == Qt::MouseEventNotSynthesized) {
        d->wheelDeltaRemainder += event->angleDelta().x();
    } else {
        d->wheelDeltaRemainder += event->angleDelta().y();
    }
#else
    d->wheelDeltaRemainder += event->angleDelta().y();
#endif
    const int steps = d->wheelDeltaRemainder / 120;
    d->wheelDeltaRemainder -= steps * 120;
    if (stepEnabled() & (steps > 0 ? StepUpEnabled : StepDownEnabled))
        stepBy(event->modifiers() & d->stepModifier ? steps * 10 : steps);
    event->accept();
}